

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

int process_stream_file(char *stream_file_name)

{
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  _Alloc_hider __s1;
  size_type sVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  size_t sVar9;
  undefined8 *puVar10;
  ulong *puVar11;
  long *plVar12;
  size_type sVar13;
  string code;
  string fileName;
  string buf;
  string parent;
  string stream;
  string sqconfig;
  string child;
  ifstream tmp;
  TrustedContext local_34c;
  string local_348;
  string local_328;
  string local_308;
  ulong local_2e8;
  string local_2e0;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  char *local_2a0;
  string local_298;
  string local_278;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  long local_238 [4];
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  std::ifstream::ifstream(local_238,stream_file_name,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_2c0 = &local_2b0;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_2c0,
               *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0] + -0x18)),0xffffffff);
    paVar1 = &local_298.field_2;
    local_298._M_dataplus._M_p = (pointer)paVar1;
    if (local_2b8 == 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,"Stream file is empty \'","");
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
      puVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_348.field_2._M_allocated_capacity = *puVar11;
        local_348.field_2._8_8_ = puVar10[3];
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      }
      else {
        local_348.field_2._M_allocated_capacity = *puVar11;
        local_348._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_348._M_string_length = puVar10[1];
      *puVar10 = puVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      puVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_328.field_2._M_allocated_capacity = *puVar11;
        local_328.field_2._8_8_ = puVar10[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar11;
        local_328._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_328._M_string_length = puVar10[1];
      *puVar10 = puVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      CompilationContext::globalError(local_328._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar1) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      iVar7 = 1;
    }
    else {
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      local_328._M_string_length = 0;
      local_328.field_2._M_allocated_capacity =
           local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      local_348._M_string_length = 0;
      local_348.field_2._M_allocated_capacity =
           local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_298._M_string_length = 0;
      local_2e8 = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      local_34c = TR_CONST;
      bVar2 = false;
      plVar8 = local_2c0;
      do {
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        local_308._M_string_length = 0;
        local_308.field_2._M_local_buf[0] = '\0';
        plVar8 = (long *)next_string((char *)plVar8,&local_308);
        if (bVar2) {
          if ((*local_308._M_dataplus._M_p != '#') || (local_308._M_dataplus._M_p[1] != '#')) {
            std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_308._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_348);
          }
          if (((*local_308._M_dataplus._M_p == '#') && (local_308._M_dataplus._M_p[1] == '#')) ||
             ((char)*plVar8 == '\0')) {
            uVar6 = process_single_source(&local_328,&local_348,&local_298,false,false);
            local_2e8 = (ulong)((uint)local_2e8 | uVar6);
            bVar2 = false;
          }
        }
        __s1._M_p = local_308._M_dataplus._M_p;
        lVar3 = *plVar8;
        if ((char)lVar3 != '\0') {
          iVar7 = strncmp(local_308._M_dataplus._M_p,"###[FILE_NAME]",0xe);
          if (iVar7 == 0) {
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            sVar9 = strlen(__s1._M_p + 0xe);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2e0,__s1._M_p + 0xe,__s1._M_p + sVar9 + 0xe);
            std::__cxx11::string::operator=((string *)&local_328,(string *)&local_2e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p);
            }
            trusted::clear();
            local_348._M_string_length = 0;
            *local_348._M_dataplus._M_p = '\0';
            bVar2 = false;
          }
          else {
            iVar7 = strncmp(__s1._M_p,"###[SQCONFIG]",0xd);
            if (iVar7 == 0) {
              local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
              sVar9 = strlen(__s1._M_p + 0xd);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2e0,__s1._M_p + 0xd,__s1._M_p + sVar9 + 0xd);
              std::__cxx11::string::operator=((string *)&local_298,(string *)&local_2e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p);
              }
            }
            else {
              iVar7 = strcmp(__s1._M_p,"###[LOCALS]");
              if (iVar7 == 0) {
                local_34c = TR_LOCAL;
              }
              else {
                iVar7 = strcmp(__s1._M_p,"###[GLOBALS]");
                if (iVar7 == 0) {
                  local_34c = TR_GLOBAL;
                }
                else {
                  iVar7 = strcmp(__s1._M_p,"###[CONSTANTS]");
                  if (iVar7 == 0) {
                    local_34c = TR_CONST;
                  }
                  else {
                    iVar7 = strcmp(__s1._M_p,"###[CODE]");
                    sVar4 = local_308._M_string_length;
                    if (iVar7 == 0) {
                      bVar2 = true;
                    }
                    else if ((local_308._M_string_length != 0) && (!bVar2)) {
                      local_2a0 = strchr(__s1._M_p,0x2e);
                      sVar13 = (long)local_2a0 - (long)__s1._M_p;
                      if (local_2a0 == (char *)0x0) {
                        sVar13 = sVar4;
                      }
                      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_2e0,__s1._M_p,__s1._M_p + sVar13);
                      pcVar5 = local_2a0;
                      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                      local_278._M_string_length = 0;
                      local_278.field_2._M_local_buf[0] = '\0';
                      if (local_2a0 != (char *)0x0) {
                        __s = local_2a0 + 1;
                        local_258[0] = local_248;
                        sVar9 = strlen(__s);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_258,__s,pcVar5 + sVar9 + 1);
                        std::__cxx11::string::operator=((string *)&local_278,(string *)local_258);
                        if (local_258[0] != local_248) {
                          operator_delete(local_258[0]);
                        }
                      }
                      trusted::add(local_34c,&local_2e0,&local_278);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_278._M_dataplus._M_p != &local_278.field_2) {
                        operator_delete(local_278._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                        operator_delete(local_2e0._M_dataplus._M_p);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
      } while ((char)lVar3 != '\0');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      iVar7 = (int)local_2e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0);
    }
  }
  else {
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,"Cannot open strem file \'","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_348);
    puVar11 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_328.field_2._M_allocated_capacity = *puVar11;
      local_328.field_2._8_8_ = plVar8[3];
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    }
    else {
      local_328.field_2._M_allocated_capacity = *puVar11;
      local_328._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_328._M_string_length = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_328);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_2b0 = *plVar12;
      lStack_2a8 = plVar8[3];
      local_2c0 = &local_2b0;
    }
    else {
      local_2b0 = *plVar12;
      local_2c0 = (long *)*plVar8;
    }
    local_2b8 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    CompilationContext::globalError((char *)local_2c0);
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    iVar7 = 1;
  }
  std::ifstream::~ifstream(local_238);
  return iVar7;
}

Assistant:

int process_stream_file(const char * stream_file_name)
{
  ifstream tmp(stream_file_name);
  if (tmp.fail())
  {
    CompilationContext::globalError((string("Cannot open strem file '") + stream_file_name + "'").c_str());
    return 1;
  }

  string stream((std::istreambuf_iterator<char>(tmp)), std::istreambuf_iterator<char>());
  if (stream.empty())
  {
    CompilationContext::globalError((string("Stream file is empty '") + stream_file_name + "'").c_str());
    return 1;
  }

  int res = 0;
  const char * p = stream.c_str();

  string fileName;
  trusted::TrustedContext trustedContext = trusted::TR_CONST;
  string code;
  string sqconfig;
  bool insideCode = false;

  for (;;)
  {
    string buf;
    p = next_string(p, buf);

    if (insideCode)
    {
      if (buf[0] != '#' || buf[1] != '#')
      {
        code += buf;
        code += "\n";
      }

      if ((buf[0] == '#' && buf[1] == '#') || !*p) // end of code
      {
        res |= process_single_source(fileName, code, sqconfig, false, false);
        insideCode = false;
      }
    }

    if (!*p)
      break;

    if (!strncmp(buf.c_str(), "###[FILE_NAME]", sizeof("###[FILE_NAME]") - 1))
    {
      fileName = string(buf.c_str() + sizeof("###[FILE_NAME]") - 1);
      trusted::clear();
      code.clear();
      insideCode = false;
    }
    else if (!strncmp(buf.c_str(), "###[SQCONFIG]", sizeof("###[SQCONFIG]") - 1))
      sqconfig = string(buf.c_str() + sizeof("###[SQCONFIG]") - 1);
    else if (!strcmp(buf.c_str(), "###[LOCALS]"))
      trustedContext = trusted::TR_LOCAL;
    else if (!strcmp(buf.c_str(), "###[GLOBALS]"))
      trustedContext = trusted::TR_GLOBAL;
    else if (!strcmp(buf.c_str(), "###[CONSTANTS]"))
      trustedContext = trusted::TR_CONST;
    else if (!strcmp(buf.c_str(), "###[CODE]"))
    {
      insideCode = true;
    }
    else if (!buf.empty() && !insideCode)
    {
      const char * dot = strchr(buf.c_str(), '.');
      string parent(buf.c_str(), dot ? dot - buf.c_str() : buf.length());
      string child;
      if (dot)
        child = string(dot + 1);

      trusted::add(trustedContext, parent, child);
    }
  }

  return res;
}